

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::LogError
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter)

{
  Bitfield<16UL> decoder;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  long lVar1;
  MessageBuilder local_3b0;
  string local_230 [32];
  Bitfield<16UL> local_210;
  stringstream local_1f8 [8];
  stringstream bitfield_string_stream;
  ostream local_1e8;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string the_log;
  GLenum parameter_local;
  offset_in_DataTest_to_subr UploadDataFunction_local;
  DataTest *this_local;
  
  lVar1 = CONCAT44(in_register_00000014,parameter);
  the_log.field_2._12_4_ = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"Unexpected error occurred during the test of ",&local_59);
  std::allocator<char>::~allocator(&local_59);
  if ((code *)UploadDataFunction == UploadUsingNamedBufferData &&
      (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_58);
  }
  else if ((code *)UploadDataFunction == UploadUsingNamedBufferSubData &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_58);
  }
  else if ((code *)UploadDataFunction == UploadUsingNamedBufferStorage &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_58);
  }
  else if ((code *)UploadDataFunction == UploadUsingCopyNamedBufferSubData &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_58);
  }
  else {
    std::__cxx11::string::append(local_58);
  }
  if ((code *)UploadDataFunction == UploadUsingNamedBufferStorage &&
      (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_58);
    std::__cxx11::stringstream::stringstream(local_1f8);
    glu::getBufferMapFlagsStr(&local_210,the_log.field_2._12_4_);
    decoder.m_begin = local_210.m_begin;
    decoder.m_value = local_210.m_value;
    decoder.m_end = local_210.m_end;
    tcu::Format::operator<<(&local_1e8,decoder);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_58);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  else {
    std::__cxx11::string::append(local_58);
    glu::getUsageName(the_log.field_2._12_4_);
    std::__cxx11::string::append(local_58);
  }
  std::__cxx11::string::append(local_58);
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_3b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void DataTest::LogError(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter)
{
	std::string the_log = "Unexpected error occurred during the test of ";

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferData)
	{
		the_log.append("glNamedBufferData");
	}
	else
	{
		if (UploadDataFunction == &DataTest::UploadUsingNamedBufferSubData)
		{
			the_log.append("glNamedBufferSubData");
		}
		else
		{
			if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
			{
				the_log.append("glNamedBufferStorage");
			}
			else
			{
				if (UploadDataFunction == &DataTest::UploadUsingCopyNamedBufferSubData)
				{
					the_log.append("glCopyNamedBufferSubData");
				}
				else
				{
					the_log.append("uknown upload function");
				}
			}
		}
	}

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
	{
		the_log.append(" called with usage parameter ");

		std::stringstream bitfield_string_stream;
		bitfield_string_stream << glu::getBufferMapFlagsStr(parameter);
		the_log.append(bitfield_string_stream.str());
	}
	else
	{
		the_log.append(" called with usage parameter ");
		the_log.append(glu::getUsageName(parameter));
	}
	the_log.append(".");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}